

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O0

void __thiscall BPTree::removeInternal(BPTree *this,keys_struct *x,Node *cursor,Node *child)

{
  float fVar1;
  keys_struct *pkVar2;
  pointer ppvVar3;
  keys_struct *pkVar4;
  ostream *poVar5;
  keys_struct local_e8;
  int local_c8;
  int local_c4;
  int j_3;
  int i_9;
  int j_2;
  int i_8;
  Node *rightNode_1;
  keys_struct local_a0;
  int local_80;
  int local_7c;
  int j_1;
  int i_7;
  int j;
  int i_6;
  Node *leftNode_1;
  int i_5;
  int i_4;
  Node *rightNode;
  int i_3;
  int i_2;
  Node *leftNode;
  int rightSibling;
  int leftSibling;
  Node *parent;
  int local_30;
  int i_1;
  int i;
  int pos;
  Node *child_local;
  Node *cursor_local;
  keys_struct *x_local;
  BPTree *this_local;
  
  _i = child;
  child_local = cursor;
  cursor_local = (Node *)x;
  x_local = (keys_struct *)this;
  if ((cursor == this->root) && (cursor->size == 1)) {
    if (cursor->ptr[1] == child) {
      pkVar2 = child->key;
      if (pkVar2 != (keys_struct *)0x0) {
        ppvVar3 = pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pkVar4 = pkVar2 + (long)ppvVar3;
        while (pkVar2 != pkVar4) {
          pkVar4 = pkVar4 + -1;
          keys_struct::~keys_struct(pkVar4);
        }
        operator_delete__(&pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)ppvVar3 * 0x20 + 8);
      }
      if (_i->ptr != (Node **)0x0) {
        operator_delete__(_i->ptr);
      }
      if (_i != (Node *)0x0) {
        operator_delete(_i,0x20);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar5,"\n");
      this->root = *child_local->ptr;
      pkVar2 = child_local->key;
      if (pkVar2 != (keys_struct *)0x0) {
        ppvVar3 = pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pkVar4 = pkVar2 + (long)ppvVar3;
        while (pkVar2 != pkVar4) {
          pkVar4 = pkVar4 + -1;
          keys_struct::~keys_struct(pkVar4);
        }
        operator_delete__(&pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)ppvVar3 * 0x20 + 8);
      }
      if (child_local->ptr != (Node **)0x0) {
        operator_delete__(child_local->ptr);
      }
      if (child_local != (Node *)0x0) {
        operator_delete(child_local,0x20);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar5,"\n");
      return;
    }
    if (*cursor->ptr == child) {
      pkVar2 = child->key;
      if (pkVar2 != (keys_struct *)0x0) {
        ppvVar3 = pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pkVar4 = pkVar2 + (long)ppvVar3;
        while (pkVar2 != pkVar4) {
          pkVar4 = pkVar4 + -1;
          keys_struct::~keys_struct(pkVar4);
        }
        operator_delete__(&pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)ppvVar3 * 0x20 + 8);
      }
      if (_i->ptr != (Node **)0x0) {
        operator_delete__(_i->ptr);
      }
      if (_i != (Node *)0x0) {
        operator_delete(_i,0x20);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar5,"\n");
      this->root = child_local->ptr[1];
      pkVar2 = child_local->key;
      if (pkVar2 != (keys_struct *)0x0) {
        ppvVar3 = pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        pkVar4 = pkVar2 + (long)ppvVar3;
        while (pkVar2 != pkVar4) {
          pkVar4 = pkVar4 + -1;
          keys_struct::~keys_struct(pkVar4);
        }
        operator_delete__(&pkVar2[-1].add_vect.super__Vector_base<void_*,_std::allocator<void_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)ppvVar3 * 0x20 + 8);
      }
      if (child_local->ptr != (Node **)0x0) {
        operator_delete__(child_local->ptr);
      }
      if (child_local != (Node *)0x0) {
        operator_delete(child_local,0x20);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Deleted 1");
      std::operator<<(poVar5,"\n");
      return;
    }
  }
  for (i_1 = 0; i_1 < cursor->size; i_1 = i_1 + 1) {
    fVar1 = cursor->key[i_1].key_value;
    if ((fVar1 == x->key_value) && (!NAN(fVar1) && !NAN(x->key_value))) break;
  }
  for (local_30 = i_1; local_30 < child_local->size; local_30 = local_30 + 1) {
    keys_struct::operator=(child_local->key + local_30,child_local->key + (local_30 + 1));
  }
  for (i_1 = 0; (i_1 < child_local->size + 1 && (child_local->ptr[i_1] != _i)); i_1 = i_1 + 1) {
  }
  for (parent._4_4_ = i_1; parent._4_4_ < child_local->size + 1; parent._4_4_ = parent._4_4_ + 1) {
    child_local->ptr[parent._4_4_] = child_local->ptr[parent._4_4_ + 1];
  }
  child_local->size = child_local->size + -1;
  if (child_local->size < 2) {
    if (child_local != this->root) {
      _rightSibling = findParent(this,this->root,child_local);
      for (i_1 = 0; i_1 < _rightSibling->size + 1; i_1 = i_1 + 1) {
        if (_rightSibling->ptr[i_1] == child_local) {
          leftNode._4_4_ = i_1 + -1;
          leftNode._0_4_ = i_1 + 1;
          break;
        }
      }
      if ((leftNode._4_4_ < 0) || (_i_3 = _rightSibling->ptr[leftNode._4_4_], _i_3->size < 3)) {
        if ((_rightSibling->size < (int)leftNode) ||
           (_i_5 = _rightSibling->ptr[(int)leftNode], _i_5->size < 3)) {
          if (leftNode._4_4_ < 0) {
            if ((int)leftNode <= _rightSibling->size) {
              _j_2 = _rightSibling->ptr[(int)leftNode];
              keys_struct::operator=
                        (child_local->key + child_local->size,
                         _rightSibling->key + ((int)leftNode + -1));
              i_9 = child_local->size + 1;
              for (j_3 = 0; j_3 < _j_2->size; j_3 = j_3 + 1) {
                keys_struct::operator=(child_local->key + i_9,_j_2->key + j_3);
              }
              local_c4 = child_local->size + 1;
              for (local_c8 = 0; local_c8 < _j_2->size + 1; local_c8 = local_c8 + 1) {
                child_local->ptr[local_c4] = _j_2->ptr[local_c8];
                _j_2->ptr[local_c8] = (Node *)0x0;
              }
              child_local->size = _j_2->size + 1 + child_local->size;
              _j_2->size = 0;
              keys_struct::keys_struct(&local_e8,_rightSibling->key + ((int)leftNode + -1));
              removeInternal(this,&local_e8,_rightSibling,_j_2);
              keys_struct::~keys_struct(&local_e8);
            }
          }
          else {
            _j = _rightSibling->ptr[leftNode._4_4_];
            keys_struct::operator=(_j->key + _j->size,_rightSibling->key + leftNode._4_4_);
            i_7 = _j->size + 1;
            for (j_1 = 0; j_1 < child_local->size; j_1 = j_1 + 1) {
              keys_struct::operator=(_j->key + i_7,child_local->key + j_1);
            }
            local_7c = _j->size + 1;
            for (local_80 = 0; local_80 < child_local->size + 1; local_80 = local_80 + 1) {
              _j->ptr[local_7c] = child_local->ptr[local_80];
              child_local->ptr[local_80] = (Node *)0x0;
            }
            _j->size = child_local->size + 1 + _j->size;
            child_local->size = 0;
            keys_struct::keys_struct(&local_a0,_rightSibling->key + leftNode._4_4_);
            removeInternal(this,&local_a0,_rightSibling,child_local);
            keys_struct::~keys_struct(&local_a0);
          }
        }
        else {
          keys_struct::operator=(child_local->key + child_local->size,_rightSibling->key + i_1);
          keys_struct::operator=(_rightSibling->key + i_1,_i_5->key);
          for (leftNode_1._4_4_ = 0; leftNode_1._4_4_ < _i_5->size + -1;
              leftNode_1._4_4_ = leftNode_1._4_4_ + 1) {
            keys_struct::operator=(_i_5->key + leftNode_1._4_4_,_i_5->key + (leftNode_1._4_4_ + 1));
          }
          child_local->ptr[child_local->size + 1] = *_i_5->ptr;
          for (leftNode_1._0_4_ = 0; (int)leftNode_1 < _i_5->size;
              leftNode_1._0_4_ = (int)leftNode_1 + 1) {
            _i_5->ptr[(int)leftNode_1] = _i_5->ptr[(int)leftNode_1 + 1];
          }
          child_local->size = child_local->size + 1;
          _i_5->size = _i_5->size + -1;
        }
      }
      else {
        for (rightNode._4_4_ = child_local->size; 0 < rightNode._4_4_;
            rightNode._4_4_ = rightNode._4_4_ + -1) {
          keys_struct::operator=
                    (child_local->key + rightNode._4_4_,child_local->key + (rightNode._4_4_ + -1));
        }
        keys_struct::operator=(child_local->key,_rightSibling->key + leftNode._4_4_);
        keys_struct::operator=(_rightSibling->key + leftNode._4_4_,_i_3->key + (_i_3->size + -1));
        for (rightNode._0_4_ = child_local->size + 1; 0 < (int)rightNode;
            rightNode._0_4_ = (int)rightNode + -1) {
          child_local->ptr[(int)rightNode] = child_local->ptr[(int)rightNode + -1];
        }
        *child_local->ptr = _i_3->ptr[_i_3->size];
        child_local->size = child_local->size + 1;
        _i_3->size = _i_3->size + -1;
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Deleted ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,x->key_value);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5," from internal node successfully\n");
  }
  return;
}

Assistant:

void removeInternal(keys_struct x, Node* cursor, Node* child)
    {
        //deleting the key x first
        //checking if key from root is to be deleted
        if(cursor == root)
        {
            if(cursor->size == 1)//if only one key is left, change root
            {
                if(cursor->ptr[1] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[0];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
                else if(cursor->ptr[0] == child)
                {
                    delete[] child->key;
                    delete[] child->ptr;
                    delete child;
                    cout << "Deleted 1" <<"\n";
                    root = cursor->ptr[1];
                    delete[] cursor->key;
                    delete[] cursor->ptr;
                    delete cursor;
                    cout << "Deleted 1" <<"\n";
                    //cout<<"Changed root node\n";
                    return;
                }
            }
        }
        int pos;
        for(pos = 0; pos < cursor->size; pos++)
        {
            if(cursor->key[pos].key_value == x.key_value)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size; i++)
        {
            cursor->key[i] = cursor->key[i+1];
        }
        //now deleting the pointer child
        for(pos = 0; pos < cursor->size+1; pos++)
        {
            if(cursor->ptr[pos] == child)
            {
                break;
            }
        }
        for(int i = pos; i < cursor->size+1; i++)
        {
            cursor->ptr[i] = cursor->ptr[i+1];
        }
        cursor->size--;
        if(cursor->size >= (MAX+1)/2-1)//no underflow
        {
            cout<<"Deleted "<< x.key_value << " " <<" from internal node successfully\n";
            return;
        }
        //cout<<"Underflow in internal node!\n";
        //underflow, try to transfer first
        if(cursor==root)return;
        Node* parent = findParent(root, cursor);
        int leftSibling, rightSibling;
        //finding left n right sibling of cursor
        for(pos = 0; pos < parent->size+1; pos++)
        {
            if(parent->ptr[pos] == cursor)
            {
                leftSibling = pos - 1;
                rightSibling = pos + 1;
                break;
            }
        }
        //try to transfer
        if(leftSibling >= 0)//if left sibling exists
        {
            Node *leftNode = parent->ptr[leftSibling];
            //check if it is possible to transfer
            if(leftNode->size >= (MAX+1)/2)
            {
                //make space for transfer of key
                for(int i = cursor->size; i > 0; i--)
                {
                    cursor->key[i] = cursor->key[i-1];
                }
                //transfer key from left sibling through parent
                cursor->key[0] = parent->key[leftSibling];
                parent->key[leftSibling] = leftNode->key[leftNode->size-1];
                //transfer last pointer from leftnode to cursor
                //make space for transfer of ptr
                for (int i = cursor->size+1; i > 0; i--)
                {
                    cursor->ptr[i] = cursor->ptr[i-1];
                }
                //transfer ptr
                cursor->ptr[0] = leftNode->ptr[leftNode->size];
                cursor->size++;
                leftNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value<<" "<< x.add_vect[0] <<" from left sibling of internal node\n";
                return;
            }
        }
        if(rightSibling <= parent->size)//check if right sibling exist
        {
            Node *rightNode = parent->ptr[rightSibling];
            //check if it is possible to transfer
            if(rightNode->size >= (MAX+1)/2)
            {
                //transfer key from right sibling through parent
                cursor->key[cursor->size] = parent->key[pos];
                parent->key[pos] = rightNode->key[0];
                for (int i = 0; i < rightNode->size -1; i++)
                {
                    rightNode->key[i] = rightNode->key[i+1];
                }
                //transfer first pointer from rightnode to cursor
                //transfer ptr
                cursor->ptr[cursor->size+1] = rightNode->ptr[0];
                for (int i = 0; i < rightNode->size; ++i)
                {
                    rightNode->ptr[i] = rightNode->ptr[i+1];
                }
                cursor->size++;
                rightNode->size--;
                //cout<<"Transferred "<<cursor->key[0].key_value << " " << x.add_vect[0] <<" from right sibling of internal node\n";
                return;
            }
        }
        //transfer wasnt posssible hence do merging
        if(leftSibling >= 0)
        {
            //leftnode + parent key + cursor
            Node *leftNode = parent->ptr[leftSibling];
            leftNode->key[leftNode->size] = parent->key[leftSibling];
            for(int i = leftNode->size+1, j = 0; j < cursor->size; j++)
            {
                leftNode->key[i] = cursor->key[j];
            }
            for(int i = leftNode->size+1, j = 0; j < cursor->size+1; j++)
            {
                leftNode->ptr[i] = cursor->ptr[j];
                cursor->ptr[j] = NULL;
            }
            leftNode->size += cursor->size+1;
            cursor->size = 0;
            //delete cursor
            removeInternal(parent->key[leftSibling], parent, cursor);
            //cout<<"Merged with left sibling\n";

        }
        else if(rightSibling <= parent->size)
        {
            //cursor + parent key + rightnode
            Node *rightNode = parent->ptr[rightSibling];
            cursor->key[cursor->size] = parent->key[rightSibling-1];
            for(int i = cursor->size+1, j = 0; j < rightNode->size; j++)
            {
                cursor->key[i] = rightNode->key[j];
            }
            for(int i = cursor->size+1, j = 0; j < rightNode->size+1; j++)
            {
                cursor->ptr[i] = rightNode->ptr[j];
                rightNode->ptr[j] = NULL;
            }
            cursor->size += rightNode->size+1;
            rightNode->size = 0;
            //delete cursor
            removeInternal(parent->key[rightSibling-1], parent, rightNode);
            //cout<<"Merged with right sibling\n";
        }
    }